

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

bool requireDeviceLinking(cmGeneratorTarget *target,cmLocalGenerator *lg,string *config)

{
  cmMakefile *this;
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  cmGlobalGenerator *this_00;
  cmValue cVar4;
  LinkClosure *pLVar5;
  cmComputeLinkInformation *cli;
  char *extraout_RDX;
  cmLinkLineComputer *this_01;
  string_view value;
  cmLinkLineDeviceComputer deviceLinkComputer;
  cmLinkLineComputer cStack_a8;
  cmStateDirectory local_68;
  cmStateSnapshot local_40;
  
  this_01 = &cStack_a8;
  this_00 = cmGeneratorTarget::GetGlobalGenerator(target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cStack_a8,"CUDA",(allocator<char> *)&local_68);
  bVar1 = cmGlobalGenerator::GetLanguageEnabled(this_00,(string *)&cStack_a8);
  std::__cxx11::string::~string((string *)&cStack_a8);
  if (bVar1) {
    TVar3 = cmGeneratorTarget::GetType(target);
    if (TVar3 != OBJECT_LIBRARY) {
      this = lg->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cStack_a8,"CMAKE_CUDA_COMPILER_HAS_DEVICE_LINK_PHASE",
                 (allocator<char> *)&local_68);
      bVar1 = cmMakefile::IsOn(this,(string *)&cStack_a8);
      std::__cxx11::string::~string((string *)&cStack_a8);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cStack_a8,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator<char> *)&local_68);
        cVar4 = cmGeneratorTarget::GetProperty(target,(string *)&cStack_a8);
        std::__cxx11::string::~string((string *)&cStack_a8);
        if (cVar4.Value != (string *)0x0) {
          value._M_str = extraout_RDX;
          value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
          bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value);
          goto LAB_0040f38a;
        }
        pLVar5 = cmGeneratorTarget::GetLinkClosure(target,config);
        bVar1 = cm::
                contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                          (&pLVar5->Languages,(char (*) [5])"CUDA");
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cStack_a8,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&local_68)
          ;
          cmGeneratorTarget::GetProperty(target,(string *)&cStack_a8);
          bVar1 = cmIsOn((cmValue)0x40f362);
          std::__cxx11::string::~string((string *)&cStack_a8);
          if (!bVar1) {
            cli = cmGeneratorTarget::GetLinkInformation(target,config);
            if (cli == (cmComputeLinkInformation *)0x0) {
              bVar2 = 1;
            }
            else {
              cmLocalGenerator::GetStateSnapshot(&local_40,lg);
              cmStateSnapshot::GetDirectory(&local_68,&local_40);
              cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
                        ((cmLinkLineDeviceComputer *)&cStack_a8,&lg->super_cmOutputConverter,
                         &local_68);
              bVar2 = cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
                                ((cmLinkLineDeviceComputer *)this_01,cli);
              cmLinkLineComputer::~cmLinkLineComputer(&cStack_a8);
            }
            goto LAB_0040f38a;
          }
          TVar3 = cmGeneratorTarget::GetType(target);
          if (TVar3 < OBJECT_LIBRARY) {
            bVar2 = 0xd >> ((byte)TVar3 & 0xf);
            goto LAB_0040f38a;
          }
        }
      }
    }
  }
  bVar2 = 0;
LAB_0040f38a:
  return (bool)(bVar2 & 1);
}

Assistant:

bool requireDeviceLinking(cmGeneratorTarget& target, cmLocalGenerator& lg,
                          const std::string& config)
{
  if (!target.GetGlobalGenerator()->GetLanguageEnabled("CUDA")) {
    return false;
  }

  if (target.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    return false;
  }

  if (!lg.GetMakefile()->IsOn("CMAKE_CUDA_COMPILER_HAS_DEVICE_LINK_PHASE")) {
    return false;
  }

  if (cmValue resolveDeviceSymbols =
        target.GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    // If CUDA_RESOLVE_DEVICE_SYMBOLS has been explicitly set we need
    // to honor the value no matter what it is.
    return cmIsOn(*resolveDeviceSymbols);
  }

  // Determine if we have any dependencies that require
  // us to do a device link step
  cmGeneratorTarget::LinkClosure const* closure =
    target.GetLinkClosure(config);

  if (cm::contains(closure->Languages, "CUDA")) {
    if (cmIsOn(target.GetProperty("CUDA_SEPARABLE_COMPILATION"))) {
      bool doDeviceLinking = false;
      switch (target.GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::EXECUTABLE:
          doDeviceLinking = true;
          break;
        default:
          break;
      }
      return doDeviceLinking;
    }

    cmComputeLinkInformation* pcli = target.GetLinkInformation(config);
    if (pcli) {
      cmLinkLineDeviceComputer deviceLinkComputer(
        &lg, lg.GetStateSnapshot().GetDirectory());
      return deviceLinkComputer.ComputeRequiresDeviceLinking(*pcli);
    }
    return true;
  }
  return false;
}